

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O3

bool __thiscall ipx::SparseMatrix::IsSorted(SparseMatrix *this)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  piVar3 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (int)((ulong)((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
  if ((int)uVar6 < 1) {
    bVar10 = true;
  }
  else {
    piVar4 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    bVar10 = false;
    do {
      iVar2 = piVar3[uVar7];
      iVar9 = piVar3[uVar7 + 1] + -1;
      if (piVar3[uVar7 + 1] + -1 < iVar2) {
        iVar9 = iVar2;
      }
      lVar8 = (long)iVar2;
      while (iVar9 != lVar8) {
        piVar1 = piVar4 + lVar8;
        lVar5 = lVar8 + 1;
        lVar8 = lVar8 + 1;
        if (piVar4[lVar5] < *piVar1) {
          return bVar10;
        }
      }
      uVar7 = uVar7 + 1;
      bVar10 = uVar6 <= uVar7;
    } while (uVar7 != uVar6);
  }
  return bVar10;
}

Assistant:

bool SparseMatrix::IsSorted() const {
    for (Int j = 0; j < cols(); j++) {
        for (Int p = begin(j); p < end(j)-1; p++)
            if (index(p) > index(p+1))
                return false;
    }
    return true;
}